

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void launch_fpmt_workers(AV1_PRIMARY *ppi)

{
  AVxWorker *pAVar1;
  AVxWorkerInterface *pAVar2;
  long in_RDI;
  AVxWorker *worker;
  int i;
  int num_workers;
  AVxWorkerInterface *winterface;
  int local_18;
  
  pAVar2 = aom_get_worker_interface();
  local_18 = *(int *)(in_RDI + 0x12440);
  while (local_18 = local_18 + -1, -1 < local_18) {
    pAVar1 = *(AVxWorker **)(in_RDI + 0x12420 + (long)local_18 * 8);
    if (local_18 == 0) {
      (*pAVar2->execute)(pAVar1);
    }
    else {
      (*pAVar2->launch)(pAVar1);
    }
  }
  return;
}

Assistant:

static inline void launch_fpmt_workers(AV1_PRIMARY *ppi) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  int num_workers = ppi->p_mt_info.p_num_workers;

  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = ppi->p_mt_info.p_workers[i];
    if (i == 0)
      winterface->execute(worker);
    else
      winterface->launch(worker);
  }
}